

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.c
# Opt level: O0

bool_t prf_model_load_with_callback(prf_model_t *model,bfile_t *bfile,prf_cb_t callback)

{
  undefined1 uVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  bool_t bVar4;
  uint32_t uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  void *pvVar9;
  prf_state_t *ppVar10;
  size_t sVar11;
  uint8_t *puVar12;
  prf_nodeinfo_t *ppVar13;
  char *pcVar14;
  size_t sVar15;
  undefined8 in_RCX;
  code *in_RDX;
  bfile_t *in_RSI;
  prf_model_t *in_RDI;
  prf_nodeinfo_t *info_1;
  uint16_t length;
  uint16_t opcode;
  int i_1;
  int children;
  int cnt_2;
  int i;
  int anodes;
  int cnt_1;
  int cnt;
  uint32_t temp2;
  uint32_t temp1;
  uint32_t nodedata;
  prf_nodeinfo_t *info;
  prf_node_t *node;
  int garbage;
  int level;
  prf_state_t *state;
  prf_node_t ***stack;
  uint in_stack_00000390;
  uint in_stack_00000394;
  FILE *in_stack_00000398;
  bfile_t *in_stack_000003a0;
  bfile_t *in_stack_ffffffffffffff48;
  uint16_t opcode_00;
  prf_state_t *in_stack_ffffffffffffff50;
  void *in_stack_ffffffffffffff58;
  uint in_stack_ffffffffffffff60;
  uint in_stack_ffffffffffffff64;
  size_t in_stack_ffffffffffffff68;
  uint in_stack_ffffffffffffff74;
  uint8_t *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined2 in_stack_ffffffffffffff84;
  undefined2 in_stack_ffffffffffffff86;
  int local_78;
  int local_6c;
  prf_node_t *local_48;
  uint local_3c;
  undefined8 *local_30;
  
  local_30 = (undefined8 *)
             prf_array_init((int)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                            (int)in_stack_ffffffffffffff50);
  pvVar9 = prf_array_init((int)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                          (int)in_stack_ffffffffffffff50);
  *local_30 = pvVar9;
  local_3c = 0;
  ppVar10 = prf_state_create();
  ppVar10->model = in_RDI;
  uVar1 = 0;
LAB_00102cc5:
  do {
    bVar4 = bf_at_eof(in_RSI);
    uVar8 = in_stack_ffffffffffffff74 & 0xffffff;
    if (bVar4 == 0) {
      uVar8 = CONCAT13(uVar1,(int3)in_stack_ffffffffffffff74) ^ 0xff000000;
    }
    in_stack_ffffffffffffff74 = uVar8;
    if ((in_stack_ffffffffffffff74 & 0x1000000) == 0) {
      if (0 < (int)local_3c) {
        prf_warn(6,"loading model left state on level %d.",(ulong)local_3c);
      }
      prf_state_destroy(in_stack_ffffffffffffff50);
      iVar7 = prf_array_count((void *)0x103472);
      if (iVar7 != 1) {
        uVar8 = prf_array_count((void *)0x103487);
        prf_error(8,"model got multiple %d root nodes",(ulong)uVar8);
        return 0;
      }
      in_RDI->header = *(prf_node_t **)*local_30;
      prf_array_free((void *)0x1034d5);
      prf_array_free((void *)0x1034e2);
      return 1;
    }
    sVar11 = bf_get_remaining_length(in_RSI);
    if (sVar11 < 4) {
      prf_error(6,"would reach EOF before reading node header.");
      goto LAB_001034f2;
    }
    if (in_RDI->mempool_id == 0) {
      local_48 = prf_node_create();
      if (local_48 == (prf_node_t *)0x0) {
        prf_error(6,"could not allocate memory for new node.");
LAB_001034f2:
        uVar8 = (uint)((ulong)in_stack_ffffffffffffff58 >> 0x20);
        opcode_00 = (uint16_t)((ulong)in_stack_ffffffffffffff48 >> 0x30);
        uVar2 = bf_get_uint16_be((bfile_t *)in_stack_ffffffffffffff50);
        uVar3 = bf_get_uint16_be((bfile_t *)in_stack_ffffffffffffff50);
        bf_rewind((bfile_t *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),uVar8);
        ppVar13 = prf_nodeinfo_get(opcode_00);
        prf_error(9,"could not load model database.");
        if (ppVar13 == (prf_nodeinfo_t *)0x0) {
          prf_error(6,"  failed while loading node with opcode %d, length: %d",(ulong)uVar2,
                    (ulong)uVar3);
        }
        else {
          prf_error(6,"  failed while loading node \"%s\" (%d), length: %d",ppVar13->name,
                    (ulong)uVar2,(ulong)uVar3);
        }
        pcVar14 = bf_get_filename(in_RSI);
        sVar11 = bf_get_position(in_RSI);
        sVar15 = bf_get_length(in_RSI);
        prf_error(6,"  file: \"%s\", position: %d (of %d)",pcVar14,sVar11,sVar15);
        prf_debug(6,"dumping node data");
        bf_hex_dump(in_stack_000003a0,in_stack_00000398,in_stack_00000394,in_stack_00000390);
        return 0;
      }
    }
    else {
      local_48 = (prf_node_t *)
                 pool_malloc((pool_t)(in_stack_ffffffffffffff68 >> 0x30),
                             (int)in_stack_ffffffffffffff68);
      if (local_48 == (prf_node_t *)0x0) {
        prf_error(6,"could not allocate memory for new node.");
        goto LAB_001034f2;
      }
      prf_node_clear(local_48);
      local_48->flags = local_48->flags | 0x100;
    }
    uVar2 = bf_peek_uint16_be(in_stack_ffffffffffffff48);
    local_48->opcode = uVar2;
    if (local_48->opcode == 0x17) {
      prf_error(1,"detected continuation (>= 15.7) - unsupported");
    }
    if (((((local_48->opcode == 0) || (local_48->opcode == 0xa000)) || (local_48->opcode == 0x3230))
        || (local_48->opcode == 0xb)) && (((int)local_3c < 1 || (local_48->opcode != 0xb)))) {
      in_stack_ffffffffffffff60 = (uint)local_48->opcode;
      in_stack_ffffffffffffff64 = local_3c;
      in_stack_ffffffffffffff68 = bf_get_position(in_RSI);
      sVar11 = bf_get_length(in_RSI);
      prf_error(1,"bogus node opcode 0x%04x at level %d, location %d/%d",
                (ulong)in_stack_ffffffffffffff60,(ulong)in_stack_ffffffffffffff64,
                in_stack_ffffffffffffff68,sVar11);
      if (local_3c == 0) {
        uVar1 = 1;
        goto LAB_00102cc5;
      }
      prf_error(1,"since level != 0, can\'t assume trailing garbage");
    }
    if (local_48->opcode == 0xb00) {
      uVar5 = bf_get_uint32_be((bfile_t *)in_stack_ffffffffffffff50);
      bf_unget_uint32_be(in_RSI,(uVar5 & 0xff00ff00) >> 8 | (uVar5 & 0xff00ff) << 8);
      uVar2 = bf_peek_uint16_be(in_stack_ffffffffffffff48);
      local_48->opcode = uVar2;
    }
    ppVar13 = prf_nodeinfo_get((uint16_t)((ulong)in_stack_ffffffffffffff48 >> 0x30));
    if ((ppVar13 == (prf_nodeinfo_t *)0x0) ||
       (ppVar13->load_f == (_func_bool_t_prf_node_t_ptr_prf_state_t_ptr_bfile_t_ptr *)0x0)) {
      uVar2 = bf_get_uint16_be((bfile_t *)in_stack_ffffffffffffff50);
      local_48->opcode = uVar2;
      uVar2 = bf_get_uint16_be((bfile_t *)in_stack_ffffffffffffff50);
      local_48->length = uVar2;
      in_stack_ffffffffffffff58 = (void *)(ulong)local_48->length;
      sVar11 = bf_get_remaining_length(in_RSI);
      if ((void *)(sVar11 + 4) < in_stack_ffffffffffffff58) goto LAB_001034f2;
      if (4 < local_48->length) {
        if (in_RDI->mempool_id == 0) {
          puVar12 = (uint8_t *)malloc((long)(int)(local_48->length - 4));
          local_48->data = puVar12;
        }
        else {
          puVar12 = (uint8_t *)
                    pool_malloc((pool_t)(in_stack_ffffffffffffff68 >> 0x30),
                                (int)in_stack_ffffffffffffff68);
          local_48->data = puVar12;
          local_48->flags = local_48->flags | 0x100;
        }
        bf_read((bfile_t *)
                CONCAT26(in_stack_ffffffffffffff86,
                         CONCAT24(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)),
                in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
      }
    }
    else {
      ppVar10->node = local_48;
      bVar4 = (*ppVar13->load_f)(local_48,ppVar10,in_RSI);
      if (bVar4 == 0) goto LAB_001034f2;
    }
    if (ppVar13 == (prf_nodeinfo_t *)0x0) {
      prf_debug(1,"node loaded: opcode %d, length %d",(ulong)local_48->opcode,
                (ulong)local_48->length);
    }
    else {
      prf_debug(1,"node loaded: \"%s\"",ppVar13->name);
    }
    if (((ppVar13->flags & 1) != 0) || ((ppVar13->flags & 0x200) != 0)) {
      iVar7 = prf_array_count((void *)0x103130);
      if (*(long *)(*(long *)(local_30[(int)local_3c] + (long)(iVar7 + -1) * 8) + 0x10) == 0) {
        prf_array_set_count(in_stack_ffffffffffffff50,
                            (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
        local_30 = (undefined8 *)
                   prf_array_append_ptr
                             ((void *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                              in_stack_ffffffffffffff58);
        pvVar9 = prf_array_init((int)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                                (int)in_stack_ffffffffffffff50);
        local_30[(int)(local_3c + 1)] = pvVar9;
      }
      if ((ppVar13->flags & 1) != 0) {
        local_3c = local_3c + 1;
      }
    }
    if ((ppVar13->flags & 0x200) == 0) {
      pvVar9 = prf_array_append_ptr
                         ((void *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                          in_stack_ffffffffffffff58);
      local_30[(int)local_3c] = pvVar9;
    }
    else {
      pvVar9 = prf_array_append_ptr
                         ((void *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                          in_stack_ffffffffffffff58);
      local_30[(int)(local_3c + 1)] = pvVar9;
      iVar7 = prf_array_count((void *)0x103238);
      *(undefined8 *)(*(long *)(local_30[(int)local_3c] + (long)(iVar7 + -1) * 8) + 0x10) =
           local_30[(int)(local_3c + 1)];
      iVar6 = prf_array_count((void *)0x103290);
      for (local_6c = 0; local_6c < iVar6; local_6c = local_6c + 1) {
        *(undefined8 *)(*(long *)(local_30[(int)(local_3c + 1)] + (long)local_6c * 8) + 0x18) =
             *(undefined8 *)(local_30[(int)local_3c] + (long)(iVar7 + -1) * 8);
      }
    }
    (*in_RDX)(local_48,in_RCX);
    if ((ppVar13->flags & 2) != 0) {
      iVar7 = prf_array_count((void *)0x10336d);
      *(undefined8 *)(*(long *)(local_30[(int)(local_3c - 1)] + (long)(iVar7 + -1) * 8) + 0x10) =
           local_30[(int)local_3c];
      iVar6 = prf_array_count((void *)0x1033c0);
      for (local_78 = 0; local_78 < iVar6; local_78 = local_78 + 1) {
        *(undefined8 *)(*(long *)(local_30[(int)local_3c] + (long)local_78 * 8) + 0x18) =
             *(undefined8 *)(local_30[(int)(local_3c - 1)] + (long)(iVar7 + -1) * 8);
      }
      local_3c = local_3c - 1;
    }
  } while( true );
}

Assistant:

bool_t
prf_model_load_with_callback(
    prf_model_t * model,
    bfile_t * bfile,
    prf_cb_t callback )
{
    /* no recursing */
    prf_node_t *** stack;
    prf_state_t * state;
    int level, garbage;

    assert( model != NULL && bfile != NULL );
    assert( model->header == NULL );

    stack = (prf_node_t ***)prf_array_init( 8, sizeof( prf_node_t ** ) );
    assert( stack != NULL );
    stack[0] = (prf_node_t **)prf_array_init( 8, sizeof( prf_node_t * ) );
    assert( stack[0] != NULL );
    level = 0;
    state = prf_state_create();
    assert( state != NULL );
    state->model = model;

    garbage = FALSE;
    while ( !bf_at_eof(bfile) && !garbage) {
        prf_node_t * node;
        prf_nodeinfo_t * info;

        if ( bf_get_remaining_length( bfile ) < 4 ) {
            prf_error( 6, "would reach EOF before reading node header." );
            goto error;
        }

        if ( model->mempool_id == 0 ) {
            node = prf_node_create();
            if ( node == NULL ) {
                prf_error( 6, "could not allocate memory for new node." );
                goto error;
            }
        } else {
            node = (prf_node_t *)pool_malloc(model->mempool_id, sizeof(prf_node_t));
            if ( node == NULL ) {
                prf_error(6, "could not allocate memory for new node.");
                goto error;
            }
            prf_node_clear(node);
            node->flags |= PRF_NODE_MEMPOOLED;
        }

        /* note that this is just a _peek_ to detect some special cases before reading
           in the node. */
        node->opcode = bf_peek_uint16_be(bfile);

        if ( node->opcode == 23 ) {
          prf_error(1, "detected continuation (>= 15.7) - unsupported");
        }

        if ( node->opcode == 0x0000 ||
             node->opcode == 0xa000 ||
             node->opcode == 0x3230 ||
             node->opcode == 11 ) {
          if ( level > 0 && node->opcode == 0x000b ) {
            /* this exception is ok */
          } else {
            prf_error(1, "bogus node opcode 0x%04x at level %d, location %d/%d",
             node->opcode, level, bf_get_position(bfile), bf_get_length(bfile));
            if ( level == 0 ) {
              garbage = TRUE;
              goto nullskip;
            } else {
              prf_error(1, "since level != 0, can't assume trailing garbage");
              assert(0);
            }
          }
        }

        if ( node->opcode == 0x0b00 ) {
          /* bugfix: this opcode is byteswapped and needs to be flipped.
             we fix it by read in the int32, flip it and then push it back on the stream
             and continue as usual. */
          uint32_t nodedata, temp1, temp2;
          nodedata = bf_get_uint32_be(bfile);
          temp1 = nodedata & 0xff00ff00;
          temp2 = nodedata & 0x00ff00ff;
          nodedata = (temp1 >> 8) | (temp2 << 8);
          bf_unget_uint32_be(bfile, nodedata);
          node->opcode = bf_peek_uint16_be(bfile);
        }

        info = prf_nodeinfo_get( node->opcode );
        if ( (info != NULL) && (info->load_f != NULL) ) {
            state->node = node;
            if ( ! (*(info->load_f))(node, state, bfile) )
                goto error;
        } else { /* unsupported node */
            node->opcode = bf_get_uint16_be( bfile );
            node->length = bf_get_uint16_be( bfile );
            if ( node->length > (bf_get_remaining_length( bfile ) + 4) )
                goto error;
            if ( node->length > 4 ) {
                if ( model->mempool_id == 0 ) {
                    node->data = (uint8_t *)malloc( node->length - 4 );
                } else {
                    node->data = (uint8_t *)pool_malloc( model->mempool_id,
                        node->length - 4 );
                    node->flags |= PRF_NODE_MEMPOOLED;
                }
                assert( node->data != NULL );
                bf_read( bfile, node->data, node->length - 4 );
            }
        }
        if ( info != NULL )
            prf_debug( 1, "node loaded: \"%s\"", info->name );
        else
            prf_debug( 1, "node loaded: opcode %d, length %d", node->opcode,
                node->length );

        assert(info != NULL);
        /* insert the node in the model */
        if ( ((info->flags & PRF_PUSH_NODE) != 0) ||
             ((info->flags & PRF_ANCILLARY) != 0) ) {
            int cnt;
            cnt = prf_array_count( stack[level] );
            if ( (stack[level])[cnt-1]->children == NULL ) {
                stack = (prf_node_t ***)prf_array_set_count( stack, level+1 );
                stack = (prf_node_t ***)prf_array_append_ptr( stack, NULL );
                stack[level+1] = 
		  (prf_node_t **)prf_array_init( 8, sizeof( prf_node_t * ) );
            }
            if ( (info->flags & PRF_PUSH_NODE) != 0 )
                level++;
        }

        if ( (info->flags & PRF_ANCILLARY) != 0 ) {
            int cnt, anodes, i;
            assert( stack[level+1] != NULL );
            stack[level+1] = 
	      (prf_node_t **)prf_array_append_ptr( stack[level+1], node );
            assert( level >= 0 );
            cnt = prf_array_count( stack[level] );
            stack[level][cnt-1]->children = (prf_node_t **) stack[level+1];
            anodes = prf_array_count( stack[level+1] );
            for ( i = 0; i < anodes; i++ )
                stack[level+1][i]->parent = stack[level][cnt-1];
        } else {
            assert( stack[level] != NULL );
            stack[level] = 
	      (prf_node_t **)prf_array_append_ptr( stack[level], node );
        }

        prf_cb_call( callback, node );

        if ( (info->flags & PRF_POP_NODE) != 0 ) {
            int cnt, children, i;
            assert(level > 0);
            cnt = prf_array_count( stack[level-1] );
            stack[level-1][cnt-1]->children = (prf_node_t **) stack[level];
            children = prf_array_count( stack[level] );
            for ( i = 0; i < children; i++ )
                stack[level][i]->parent = stack[level-1][cnt-1];
            level--;
        }
nullskip:
	;
    } /* while ( ! bf_at_eof( bfile ) ) */

    if ( level > 0 )
        prf_warn( 6, "loading model left state on level %d.", level );

    prf_state_destroy( state );
    if ( prf_array_count( stack[0] ) != 1 ) {
        prf_error( 8, "model got multiple %d root nodes",
            prf_array_count( stack[0] ) );
        return FALSE;
    }

    assert( prf_array_count( stack ) > 0 &&
        stack[0] != NULL && prf_array_count( stack[0] ) > 0 );
    model->header = stack[0][0];
    prf_array_free( stack[0] );
    prf_array_free( stack );
    return TRUE;

error:
    do {
        uint16_t opcode;
        uint16_t length;
        prf_nodeinfo_t * info;
        opcode = bf_get_uint16_be( bfile );
        length = bf_get_uint16_be( bfile );
        bf_rewind( bfile, 4 );
        info = prf_nodeinfo_get( opcode );
        prf_error( 9, "could not load model database." );
        if ( info != NULL ) {
            prf_error( 6, "  failed while loading node \"%s\" (%d), length: %d",
                info->name, opcode, length );
        } else {
            prf_error( 6,
                "  failed while loading node with opcode %d, length: %d",
                opcode, length );
        }
        prf_error( 6, "  file: \"%s\", position: %d (of %d)",
            bf_get_filename( bfile ), bf_get_position( bfile ),
            bf_get_length( bfile ) );

        prf_debug( 6, "dumping node data" );
        bf_hex_dump( bfile, stderr, length, 4 );
    } while ( FALSE );
    return FALSE;
}